

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# znzlib.c
# Opt level: O0

size_t znzread(void *buf,size_t size,size_t nmemb,znzFile file)

{
  int iVar1;
  char *local_50;
  int nread;
  uint n2read;
  char *cbuf;
  size_t remain;
  znzFile file_local;
  size_t nmemb_local;
  size_t size_local;
  void *buf_local;
  
  cbuf = (char *)(size * nmemb);
  if (file == (znzFile)0x0) {
    buf_local = (void *)0x0;
  }
  else {
    _nread = buf;
    if (file->zfptr == (gzFile)0x0) {
      buf_local = (void *)fread(buf,size,nmemb,(FILE *)file->nzfptr);
    }
    else {
      do {
        if (cbuf == (char *)0x0) break;
        if (cbuf < (char *)0x40000000) {
          local_50 = cbuf;
        }
        else {
          local_50 = (char *)0x40000000;
        }
        iVar1 = gzread(file->zfptr,_nread,(ulong)local_50 & 0xffffffff);
        if (iVar1 < 0) {
          return (long)iVar1;
        }
        cbuf = cbuf + -(long)iVar1;
        _nread = (void *)((long)_nread + (long)iVar1);
      } while ((int)local_50 <= iVar1);
      if ((cbuf != (char *)0x0) && (cbuf < size)) {
        fprintf(_stderr,"** znzread: read short by %u bytes\n",(ulong)cbuf & 0xffffffff);
      }
      buf_local = (void *)(nmemb - (ulong)cbuf / size);
    }
  }
  return (size_t)buf_local;
}

Assistant:

size_t znzread(void* buf, size_t size, size_t nmemb, znzFile file)
{
  size_t     remain = size*nmemb;
  char     * cbuf = (char *)buf;
  unsigned   n2read;
  int        nread;

  if (file==NULL) { return 0; }
#ifdef HAVE_ZLIB
  if (file->zfptr!=NULL) {
    /* gzread/write take unsigned int length, so maybe read in int pieces
       (noted by M Hanke, example given by M Adler)   6 July 2010 [rickr] */
    while( remain > 0 ) {
       n2read = (remain < ZNZ_MAX_BLOCK_SIZE) ? remain : ZNZ_MAX_BLOCK_SIZE;
       nread = gzread(file->zfptr, (void *)cbuf, n2read);
       if( nread < 0 ) return nread; /* returns -1 on error */

       remain -= nread;
       cbuf += nread;

       /* require reading n2read bytes, so we don't get stuck */
       if( nread < (int)n2read ) break;  /* return will be short */
    }

    /* warn of a short read that will seem complete */
    if( remain > 0 && remain < size )
       fprintf(stderr,"** znzread: read short by %u bytes\n",(unsigned)remain);

    return nmemb - remain/size;   /* return number of members processed */
  }
#endif
  return fread(buf,size,nmemb,file->nzfptr);
}